

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O1

void __thiscall
vkt::DynamicState::anon_unknown_0::DepthBiasBaseCase::beginRenderPass(DepthBiasBaseCase *this)

{
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> local_128;
  VkClearDepthStencilValue depthStencilClearValue;
  RenderPassBeginInfo renderPassBegin;
  VkClearColorValue clearColor;
  ImageSubresourceRange local_98;
  ImageSubresourceRange local_84;
  ImageSubresourceRange subresourceRangeImage;
  VkMemoryBarrier memBarrier;
  CmdBufferBeginInfo beginInfo;
  
  clearColor._0_8_ = 0;
  clearColor._8_8_ = 0x3f80000000000000;
  Draw::CmdBufferBeginInfo::CmdBufferBeginInfo(&beginInfo,0);
  (*this->m_vk->_vptr_DeviceInterface[0x49])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             &beginInfo);
  Draw::initialTransitionColor2DImage
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (VkImage)(((this->m_colorTargetImage).m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,
             VK_IMAGE_LAYOUT_GENERAL);
  Draw::initialTransitionDepthStencil2DImage
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (VkImage)(((this->m_depthStencilImage).m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0,0x1000);
  Draw::ImageSubresourceRange::ImageSubresourceRange(&subresourceRangeImage,1,0,1,0,1);
  (*this->m_vk->_vptr_DeviceInterface[0x66])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (((this->m_colorTargetImage).m_ptr)->m_object).
             super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1,&clearColor,1,
             &subresourceRangeImage);
  depthStencilClearValue.depth = 0.0;
  depthStencilClearValue.stencil = 0;
  Draw::ImageSubresourceRange::ImageSubresourceRange(&local_98,2,0,1,0,1);
  Draw::ImageSubresourceRange::ImageSubresourceRange(&local_84,4,0,1,0,1);
  (*this->m_vk->_vptr_DeviceInterface[0x67])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (((this->m_depthStencilImage).m_ptr)->m_object).
             super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,7,
             &depthStencilClearValue,2,&local_98);
  memBarrier.srcAccessMask = 0x1000;
  memBarrier.dstAccessMask = 0x780;
  memBarrier.sType = VK_STRUCTURE_TYPE_MEMORY_BARRIER;
  memBarrier._4_4_ = 0;
  memBarrier.pNext._0_4_ = 0;
  memBarrier.pNext._4_4_ = 0;
  (*this->m_vk->_vptr_DeviceInterface[0x6d])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             0x1000,0x700,0,1,&memBarrier,0,0,0,0);
  local_128.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Draw::RenderPassBeginInfo::RenderPassBeginInfo
            (&renderPassBegin,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,
             (VkFramebuffer)
             (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
             m_internal,(VkRect2D)(ZEXT816(0x8000000080) << 0x40),&local_128);
  if (local_128.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Draw::transition2DImage
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (VkImage)(((this->m_depthStencilImage).m_ptr)->m_object).
                      super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,6,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
             0x1000,0x400);
  (*this->m_vk->_vptr_DeviceInterface[0x74])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             &renderPassBegin,0);
  if (renderPassBegin.m_clearValues.
      super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(renderPassBegin.m_clearValues.
                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)renderPassBegin.m_clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)renderPassBegin.m_clearValues.
                          super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void beginRenderPass (void)
	{
		const vk::VkClearColorValue clearColor = { { 0.0f, 0.0f, 0.0f, 1.0f } };
		beginRenderPassWithClearColor(clearColor);
	}